

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinFerTron_dns.c
# Opt level: O0

void PrintFinalStats(void *kmem)

{
  undefined4 uVar1;
  undefined8 in_RDI;
  int retval;
  long nfeD;
  long nje;
  long nfe;
  long nni;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  void *in_stack_ffffffffffffffd8;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  undefined8 local_8;
  
  local_8 = in_RDI;
  uVar1 = KINGetNumNonlinSolvIters(in_RDI,&local_10);
  check_retval(in_stack_ffffffffffffffd8,(char *)CONCAT44(uVar1,in_stack_ffffffffffffffd0),
               in_stack_ffffffffffffffcc);
  uVar1 = KINGetNumFuncEvals(local_8,&local_18);
  check_retval(in_stack_ffffffffffffffd8,(char *)CONCAT44(uVar1,in_stack_ffffffffffffffd0),
               in_stack_ffffffffffffffcc);
  uVar1 = KINGetNumJacEvals(local_8,&local_20);
  check_retval(in_stack_ffffffffffffffd8,(char *)CONCAT44(uVar1,in_stack_ffffffffffffffd0),
               in_stack_ffffffffffffffcc);
  uVar1 = KINGetNumLinFuncEvals(local_8,&stack0xffffffffffffffd8);
  check_retval(in_stack_ffffffffffffffd8,(char *)CONCAT44(uVar1,in_stack_ffffffffffffffd0),
               in_stack_ffffffffffffffcc);
  printf("Final Statistics:\n");
  printf("  nni = %5ld    nfe  = %5ld \n",local_10,local_18);
  printf("  nje = %5ld    nfeD = %5ld \n",local_20,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

static void PrintFinalStats(void* kmem)
{
  long int nni, nfe, nje, nfeD;
  int retval;

  retval = KINGetNumNonlinSolvIters(kmem, &nni);
  check_retval(&retval, "KINGetNumNonlinSolvIters", 1);
  retval = KINGetNumFuncEvals(kmem, &nfe);
  check_retval(&retval, "KINGetNumFuncEvals", 1);

  retval = KINGetNumJacEvals(kmem, &nje);
  check_retval(&retval, "KINGetNumJacEvals", 1);
  retval = KINGetNumLinFuncEvals(kmem, &nfeD);
  check_retval(&retval, "KINGetNumLinFuncEvals", 1);

  printf("Final Statistics:\n");
  printf("  nni = %5ld    nfe  = %5ld \n", nni, nfe);
  printf("  nje = %5ld    nfeD = %5ld \n", nje, nfeD);
}